

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  GRULayerParams *this_00;
  WeightParams *pWVar3;
  string *psVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_01;
  reference params_00;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  byte local_3d2;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  byte local_382;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  byte local_331;
  uint64_t local_330;
  uint64_t bias_size;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  byte local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  byte local_282;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  byte local_231;
  uint64_t local_230;
  uint64_t recurrent_matrix_size;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  byte local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  byte local_182;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  byte local_131;
  uint64_t local_130;
  uint64_t outSize;
  uint64_t input_matrix_size;
  undefined1 local_100 [8];
  string err;
  WeightParamType local_d8;
  WeightParamType local_d4;
  WeightParamType local_d0;
  WeightParamType local_cc;
  WeightParamType local_c8;
  WeightParamType local_c4;
  WeightParamType local_c0;
  WeightParamType local_bc;
  undefined1 local_b8 [8];
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  bool hasBiasVectors;
  GRULayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  local_39 = 0;
  validateOutputCount(__return_storage_ptr__,local_20,2,2);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_39 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_39 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  pNVar1 = local_20;
  if (local_38 != 0) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    local_3a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"GRU",&local_61);
    validateInputOutputRankEquality(__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_3a = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_3a & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
    local_62 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GRU",(allocator<char> *)((long)&params + 7));
    validateRankCount(__return_storage_ptr__,pNVar1,&local_88,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_62 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_62 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 != 0) {
      return __return_storage_ptr__;
    }
  }
  this_00 = Specification::NeuralNetworkLayer::gru(local_20);
  weightTypeList.
  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       Specification::GRULayerParams::hasbiasvectors(this_00);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8);
  pWVar3 = Specification::GRULayerParams::updategateweightmatrix(this_00);
  local_bc = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_bc);
  pWVar3 = Specification::GRULayerParams::updategaterecursionmatrix(this_00);
  local_c0 = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_c0);
  pWVar3 = Specification::GRULayerParams::resetgateweightmatrix(this_00);
  local_c4 = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_c4);
  pWVar3 = Specification::GRULayerParams::resetgaterecursionmatrix(this_00);
  local_c8 = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_c8);
  pWVar3 = Specification::GRULayerParams::outputgateweightmatrix(this_00);
  local_cc = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_cc);
  pWVar3 = Specification::GRULayerParams::outputgaterecursionmatrix(this_00);
  local_d0 = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8,
             &local_d0);
  if ((weightTypeList.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    pWVar3 = Specification::GRULayerParams::updategatebiasvector(this_00);
    local_d4 = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8
               ,&local_d4);
    pWVar3 = Specification::GRULayerParams::resetgatebiasvector(this_00);
    local_d8 = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8
               ,&local_d8);
    pWVar3 = Specification::GRULayerParams::outputgatebiasvector(this_00);
    err.field_2._12_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8
               ,(value_type *)(err.field_2._M_local_buf + 0xc));
  }
  bVar2 = isWeightParamTypeCompatible
                    ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
                     local_b8);
  if (bVar2) {
    uVar5 = Specification::GRULayerParams::inputvectorsize(this_00);
    uVar6 = Specification::GRULayerParams::outputvectorsize(this_00);
    outSize = uVar5 * uVar6;
    local_130 = Specification::GRULayerParams::outputvectorsize(this_00);
    local_131 = 0;
    pWVar3 = Specification::GRULayerParams::updategateweightmatrix(this_00);
    uVar6 = outSize;
    uVar5 = local_130;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"GRU",&local_159);
    psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"update gate weight matrix",&local_181);
    validateGeneralWeightParams
              (__return_storage_ptr__,pWVar3,uVar6,uVar5,&local_158,psVar4,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_131 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_131 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_38 == 0) {
      local_182 = 0;
      pWVar3 = Specification::GRULayerParams::resetgateweightmatrix(this_00);
      uVar6 = outSize;
      uVar5 = local_130;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"GRU",&local_1a9);
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"reset gate weight matrix",&local_1d1);
      validateGeneralWeightParams
                (__return_storage_ptr__,pWVar3,uVar6,uVar5,&local_1a8,psVar4,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      bVar2 = Result::good(__return_storage_ptr__);
      if (!bVar2) {
        local_182 = 1;
      }
      local_38 = (uint)!bVar2;
      if ((local_182 & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        local_1d2 = 0;
        pWVar3 = Specification::GRULayerParams::outputgateweightmatrix(this_00);
        uVar6 = outSize;
        uVar5 = local_130;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"GRU",&local_1f9);
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"output gate weight matrix",
                   (allocator<char> *)((long)&recurrent_matrix_size + 7));
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar3,uVar6,uVar5,&local_1f8,psVar4,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)((long)&recurrent_matrix_size + 7));
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_1d2 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_1d2 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 == 0) {
          uVar5 = Specification::GRULayerParams::outputvectorsize(this_00);
          local_230 = Specification::GRULayerParams::outputvectorsize(this_00);
          local_230 = uVar5 * local_230;
          local_231 = 0;
          pWVar3 = Specification::GRULayerParams::updategaterecursionmatrix(this_00);
          uVar6 = local_130;
          uVar5 = local_230;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"GRU",&local_259);
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"update gate recursion matrix",&local_281);
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar3,uVar5,uVar6,&local_258,psVar4,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            local_231 = 1;
          }
          local_38 = (uint)!bVar2;
          if ((local_231 & 1) == 0) {
            Result::~Result(__return_storage_ptr__);
          }
          if (local_38 == 0) {
            local_282 = 0;
            pWVar3 = Specification::GRULayerParams::resetgaterecursionmatrix(this_00);
            uVar6 = local_130;
            uVar5 = local_230;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,"GRU",&local_2a9);
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d0,"reset gate recursion matrix",&local_2d1);
            validateGeneralWeightParams
                      (__return_storage_ptr__,pWVar3,uVar5,uVar6,&local_2a8,psVar4,&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::allocator<char>::~allocator(&local_2d1);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::allocator<char>::~allocator(&local_2a9);
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              local_282 = 1;
            }
            local_38 = (uint)!bVar2;
            if ((local_282 & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
            if (local_38 == 0) {
              local_2d2 = 0;
              pWVar3 = Specification::GRULayerParams::outputgaterecursionmatrix(this_00);
              uVar6 = local_130;
              uVar5 = local_230;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2f8,"GRU",&local_2f9);
              psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_320,"output gate recursion matrix",
                         (allocator<char> *)((long)&bias_size + 7));
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar3,uVar5,uVar6,&local_2f8,psVar4,&local_320);
              std::__cxx11::string::~string((string *)&local_320);
              std::allocator<char>::~allocator((allocator<char> *)((long)&bias_size + 7));
              std::__cxx11::string::~string((string *)&local_2f8);
              std::allocator<char>::~allocator(&local_2f9);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                local_2d2 = 1;
              }
              local_38 = (uint)!bVar2;
              if ((local_2d2 & 1) == 0) {
                Result::~Result(__return_storage_ptr__);
              }
              if (local_38 == 0) {
                if ((weightTypeList.
                     super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  local_330 = Specification::GRULayerParams::outputvectorsize(this_00);
                  local_331 = 0;
                  pWVar3 = Specification::GRULayerParams::updategatebiasvector(this_00);
                  uVar5 = local_330;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_358,"GRU",&local_359);
                  psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_380,"update gate bias vector",&local_381);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,pWVar3,uVar5,1,&local_358,psVar4,&local_380);
                  std::__cxx11::string::~string((string *)&local_380);
                  std::allocator<char>::~allocator(&local_381);
                  std::__cxx11::string::~string((string *)&local_358);
                  std::allocator<char>::~allocator(&local_359);
                  bVar2 = Result::good(__return_storage_ptr__);
                  if (!bVar2) {
                    local_331 = 1;
                  }
                  local_38 = (uint)!bVar2;
                  if ((local_331 & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 != 0) goto LAB_004ca14d;
                  local_382 = 0;
                  pWVar3 = Specification::GRULayerParams::resetgatebiasvector(this_00);
                  uVar5 = local_330;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3a8,"GRU",&local_3a9);
                  psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3d0,"reset gate bias vector",&local_3d1);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,pWVar3,uVar5,1,&local_3a8,psVar4,&local_3d0);
                  std::__cxx11::string::~string((string *)&local_3d0);
                  std::allocator<char>::~allocator(&local_3d1);
                  std::__cxx11::string::~string((string *)&local_3a8);
                  std::allocator<char>::~allocator(&local_3a9);
                  bVar2 = Result::good(__return_storage_ptr__);
                  if (!bVar2) {
                    local_382 = 1;
                  }
                  local_38 = (uint)!bVar2;
                  if ((local_382 & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 != 0) goto LAB_004ca14d;
                  local_3d2 = 0;
                  pWVar3 = Specification::GRULayerParams::outputgatebiasvector(this_00);
                  uVar5 = local_330;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3f8,"GRU",&local_3f9);
                  psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_420,"output gate bias vector",
                             (allocator<char> *)((long)&__range1 + 7));
                  validateGeneralWeightParams
                            (__return_storage_ptr__,pWVar3,uVar5,1,&local_3f8,psVar4,&local_420);
                  std::__cxx11::string::~string((string *)&local_420);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
                  std::__cxx11::string::~string((string *)&local_3f8);
                  std::allocator<char>::~allocator(&local_3f9);
                  bVar2 = Result::good(__return_storage_ptr__);
                  if (!bVar2) {
                    local_3d2 = 1;
                  }
                  local_38 = (uint)!bVar2;
                  if ((local_3d2 & 1) == 0) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 != 0) goto LAB_004ca14d;
                }
                this_01 = Specification::GRULayerParams::activations(this_00);
                __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>
                         ::begin(this_01);
                activation = (ActivationParams *)
                             google::protobuf::
                             RepeatedPtrField<CoreML::Specification::ActivationParams>::end(this_01)
                ;
                while (bVar2 = google::protobuf::internal::
                               RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
                               operator!=(&__end1,(iterator *)&activation), bVar2) {
                  params_00 = google::protobuf::internal::
                              RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
                              operator*(&__end1);
                  validateRecurrentActivationParams(__return_storage_ptr__,params_00);
                  bVar2 = Result::good(__return_storage_ptr__);
                  local_38 = (uint)!bVar2;
                  if (bVar2) {
                    Result::~Result(__return_storage_ptr__);
                  }
                  if (local_38 != 0) goto LAB_004ca14d;
                  google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator++
                            (&__end1);
                }
                Result::Result(__return_storage_ptr__);
                local_38 = 1;
              }
            }
          }
        }
      }
    }
  }
  else {
    psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &input_matrix_size,"GRU layer \'",psVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &input_matrix_size,
                   "\' has invalid weight/recursion matrix or bias fields. Field value types should match and should be either half or full precision"
                  );
    std::__cxx11::string::~string((string *)&input_matrix_size);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_100);
    local_38 = 1;
    std::__cxx11::string::~string((string *)local_100);
  }
LAB_004ca14d:
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::~vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "GRU", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "GRU", 5, 5, blobNameToRank));
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate weight matrix"));

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate recursion matrix"));

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "update gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "reset gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "output gate bias vector"));
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    return Result();
}